

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O3

void Col_ListIterArray(ColListIterator *it,size_t length,Col_Word *elements)

{
  it->list = 0;
  it->length = length;
  it->index = 0;
  (it->chunk).first = 0;
  (it->chunk).last = length - 1;
  (it->chunk).accessProc = (undefined1 *)0x0;
  (it->chunk).current.direct = elements;
  return;
}

Assistant:

void
Col_ListIterArray(
    Col_ListIterator it,        /*!< Iterator to initialize. */
    size_t length,              /*!< Number of elements in array. */
    const Col_Word * elements)  /*!< Array of elements. */
{
    it->list = WORD_NIL;
    it->length = length;
    it->index = 0;

    it->chunk.first = 0;
    it->chunk.last = length-1;
    it->chunk.accessProc = NULL;
    it->chunk.current.direct = elements;
}